

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

void xmlSchematronFree(xmlSchematronPtr schema)

{
  xmlSchematronPtr schema_local;
  
  if (schema != (xmlSchematronPtr)0x0) {
    if ((schema->doc != (xmlDocPtr)0x0) && (schema->preserve == 0)) {
      xmlFreeDoc(schema->doc);
    }
    if (schema->namespaces != (xmlChar **)0x0) {
      (*xmlFree)(schema->namespaces);
    }
    xmlSchematronFreeRules(schema->rules);
    xmlSchematronFreePatterns(schema->patterns);
    xmlDictFree(schema->dict);
    (*xmlFree)(schema);
  }
  return;
}

Assistant:

void
xmlSchematronFree(xmlSchematronPtr schema)
{
    if (schema == NULL)
        return;

    if ((schema->doc != NULL) && (!(schema->preserve)))
        xmlFreeDoc(schema->doc);

    if (schema->namespaces != NULL)
        xmlFree((char **) schema->namespaces);

    xmlSchematronFreeRules(schema->rules);
    xmlSchematronFreePatterns(schema->patterns);
    xmlDictFree(schema->dict);
    xmlFree(schema);
}